

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

SinkNextBatchType __thiscall
duckdb::PipelineExecutor::NextBatch(PipelineExecutor *this,DataChunk *source_chunk)

{
  SourcePartitionInfo *this_00;
  GlobalSinkState *params;
  int iVar1;
  PhysicalOperator *pPVar2;
  type pGVar3;
  type pLVar4;
  pointer pLVar5;
  idx_t iVar6;
  idx_t iVar7;
  InternalException *pIVar8;
  SinkNextBatchType SVar9;
  ulong uVar10;
  allocator local_91;
  OperatorSinkNextBatchInput next_batch_input;
  string local_70;
  OperatorPartitionData next_data;
  
  uVar10 = this->pipeline->base_batch_index + 9999999999999;
  next_data.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next_data.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  next_data.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  next_data.batch_index = uVar10;
  if (source_chunk->count != 0) {
    pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->source);
    pGVar3 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->pipeline->source_state);
    pLVar4 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             ::operator*(&this->local_source_state);
    (*pPVar2->_vptr_PhysicalOperator[0x12])
              (&next_batch_input,pPVar2,&this->context,source_chunk,pGVar3,pLVar4,
               &this->required_partition_info);
    params = next_batch_input.global_state;
    OperatorPartitionData::operator=(&next_data,(OperatorPartitionData *)&next_batch_input);
    next_data.batch_index =
         (long)&params->_vptr_GlobalSinkState + this->pipeline->base_batch_index + 1;
    if (uVar10 <= next_data.batch_index) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_70,
                 "Pipeline batch index - invalid batch index %llu returned by source operator",
                 &local_91);
      InternalException::InternalException<unsigned_long>(pIVar8,&local_70,(unsigned_long)params);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::
    ~vector((vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *)
            &next_batch_input.local_state);
  }
  pLVar5 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
           operator->(&this->local_sink_state);
  iVar7 = next_data.batch_index;
  this_00 = &pLVar5->partition_info;
  iVar6 = optional_idx::GetIndex(&this_00->batch_index);
  if (iVar7 != iVar6) {
    iVar7 = optional_idx::GetIndex(&this_00->batch_index);
    if (next_data.batch_index < iVar7) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&next_batch_input,
                 "Pipeline batch index - gotten lower batch index %llu (down from previous batch index of %llu)"
                 ,(allocator *)&local_70);
      iVar7 = next_data.batch_index;
      iVar6 = optional_idx::GetIndex(&this_00->batch_index);
      InternalException::InternalException<unsigned_long,unsigned_long>
                (pIVar8,(string *)&next_batch_input,iVar7,iVar6);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar7 = optional_idx::GetIndex(&this_00->batch_index);
    optional_idx::optional_idx((optional_idx *)&next_batch_input,next_data.batch_index);
    (pLVar5->partition_info).batch_index.index = (idx_t)next_batch_input.global_state;
    ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::
    _M_move_assign(&(pLVar5->partition_info).partition_data.
                    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                   ,&next_data.partition_data);
    pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    next_batch_input.global_state =
         unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
         operator*(&pPVar2->sink_state);
    next_batch_input.local_state =
         unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
         operator*(&this->local_sink_state);
    next_batch_input.interrupt_state = &this->interrupt_state;
    pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    iVar1 = (*pPVar2->_vptr_PhysicalOperator[0x1e])(pPVar2,&this->context,&next_batch_input);
    if ((char)iVar1 == '\x01') {
      optional_idx::optional_idx((optional_idx *)&local_70,iVar7);
      (this_00->batch_index).index = (idx_t)local_70._M_dataplus._M_p;
      SVar9 = BLOCKED;
      goto LAB_00484777;
    }
    iVar7 = Pipeline::UpdateBatchIndex(this->pipeline,iVar7,next_data.batch_index);
    optional_idx::optional_idx((optional_idx *)&local_70,iVar7);
    (pLVar5->partition_info).min_batch_index.index = (idx_t)local_70._M_dataplus._M_p;
  }
  SVar9 = READY;
LAB_00484777:
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&next_data.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  return SVar9;
}

Assistant:

SinkNextBatchType PipelineExecutor::NextBatch(DataChunk &source_chunk) {
	D_ASSERT(required_partition_info.AnyRequired());
	auto max_batch_index = pipeline.base_batch_index + PipelineBuildState::BATCH_INCREMENT - 1;
	// by default set it to the maximum valid batch index value for the current pipeline
	OperatorPartitionData next_data(max_batch_index);
	if (source_chunk.size() > 0) {
		// if we retrieved data - initialize the next batch index
		auto partition_data = pipeline.source->GetPartitionData(context, source_chunk, *pipeline.source_state,
		                                                        *local_source_state, required_partition_info);
		auto batch_index = partition_data.batch_index;
		// we start with the base_batch_index as a valid starting value. Make sure that next batch is called below
		next_data = std::move(partition_data);
		next_data.batch_index = pipeline.base_batch_index + batch_index + 1;
		if (next_data.batch_index >= max_batch_index) {
			throw InternalException("Pipeline batch index - invalid batch index %llu returned by source operator",
			                        batch_index);
		}
	}
	auto &partition_info = local_sink_state->partition_info;
	if (next_data.batch_index == partition_info.batch_index.GetIndex()) {
		// no changes, return
		return SinkNextBatchType::READY;
	}
	// batch index has changed - update it
	if (partition_info.batch_index.GetIndex() > next_data.batch_index) {
		throw InternalException(
		    "Pipeline batch index - gotten lower batch index %llu (down from previous batch index of %llu)",
		    next_data.batch_index, partition_info.batch_index.GetIndex());
	}
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_next_batch_count < debug_blocked_target_count) {
		debug_blocked_next_batch_count++;

		auto &callback_state = interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return SinkNextBatchType::BLOCKED;
	}
#endif
	auto current_batch = partition_info.batch_index.GetIndex();
	partition_info.batch_index = next_data.batch_index;
	partition_info.partition_data = std::move(next_data.partition_data);
	OperatorSinkNextBatchInput next_batch_input {*pipeline.sink->sink_state, *local_sink_state, interrupt_state};
	// call NextBatch before updating min_batch_index to provide the opportunity to flush the previous batch
	auto next_batch_result = pipeline.sink->NextBatch(context, next_batch_input);

	if (next_batch_result == SinkNextBatchType::BLOCKED) {
		partition_info.batch_index = current_batch; // set batch_index back to what it was before
		return SinkNextBatchType::BLOCKED;
	}

	partition_info.min_batch_index = pipeline.UpdateBatchIndex(current_batch, next_data.batch_index);

	return SinkNextBatchType::READY;
}